

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

ITexture * __thiscall
irr::video::COpenGLDriver::createDeviceDependentTexture
          (COpenGLDriver *this,path *name,IImage *image)

{
  COpenGLCoreTexture<irr::video::COpenGLDriver> *this_00;
  array<irr::video::IImage_*> imageArray;
  IImage *local_50;
  array<irr::video::IImage_*> local_48;
  
  local_48.m_data.super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_data.super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_data.super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.is_sorted = true;
  local_50 = image;
  std::vector<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>::reserve
            (&local_48.m_data,1);
  core::array<irr::video::IImage_*>::push_back(&local_48,&local_50);
  this_00 = (COpenGLCoreTexture<irr::video::COpenGLDriver> *)operator_new(0x108);
  COpenGLCoreTexture<irr::video::COpenGLDriver>::COpenGLCoreTexture
            (this_00,name,&local_48,ETT_2D,this);
  if (local_48.m_data.
      super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_data.
                    super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_data.
                          super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_data.
                          super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return &this_00->super_ITexture;
}

Assistant:

ITexture *COpenGLDriver::createDeviceDependentTexture(const io::path &name, IImage *image)
{
	core::array<IImage *> imageArray(1);
	imageArray.push_back(image);

	COpenGLTexture *texture = new COpenGLTexture(name, imageArray, ETT_2D, this);

	return texture;
}